

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O1

void av1_temporal_filter(AV1_COMP *cpi,int filter_frame_lookahead_idx,int gf_frame_index,
                        FRAME_DIFF *frame_diff,YV12_BUFFER_CONFIG *output_frame)

{
  double *noise_level;
  TemporalFilterData *pTVar1;
  scale_factors *sf;
  uint8_t **ppuVar2;
  FRAME_UPDATE_TYPE FVar3;
  FRAME_TYPE FVar4;
  AV1_PRIMARY *pAVar5;
  SequenceHeader *pSVar6;
  YV12_BUFFER_CONFIG *pYVar7;
  MB_MODE_INFO **ppMVar8;
  ulong uVar9;
  int64_t iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  lookahead_entry *frame;
  byte *pbVar16;
  lookahead_entry *plVar17;
  MB_MODE_INFO *pMVar18;
  uint32_t *puVar19;
  uint16_t *puVar20;
  void *pvVar21;
  uint8_t *puVar22;
  buf_2d *pbVar23;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  FIRSTPASS_STATS *pFVar27;
  ulong uVar28;
  long lVar29;
  int *piVar30;
  uint uVar31;
  FIRSTPASS_STATS *pFVar32;
  size_t size;
  uint b_frames;
  uint uVar33;
  ThreadData_conflict *td;
  bool bVar34;
  double dVar35;
  double dVar36;
  int iVar37;
  double dVar38;
  double dVar39;
  uint8_t *input_buffer [3];
  undefined8 auStack_48 [3];
  
  (cpi->tf_ctx).num_frames = 0;
  (cpi->tf_ctx).filter_frame_idx = -1;
  (cpi->tf_ctx).output_frame = output_frame;
  (cpi->tf_ctx).compute_frame_diff = (uint)(frame_diff != (FRAME_DIFF *)0x0);
  pAVar5 = cpi->ppi;
  FVar3 = (pAVar5->gf_group).update_type[gf_frame_index];
  FVar4 = (pAVar5->gf_group).frame_type[gf_frame_index];
  iVar11 = av1_gop_check_forward_keyframe(&pAVar5->gf_group,gf_frame_index);
  iVar14 = (cpi->oxcf).algo_cfg.arnr_max_frames;
  iVar37 = 1;
  if (1 < iVar14) {
    iVar37 = iVar14;
  }
  uVar12 = av1_lookahead_depth(cpi->ppi->lookahead,cpi->compressor_stage);
  uVar25 = (cpi->rc).frames_since_key + filter_frame_lookahead_idx;
  if ((int)uVar25 < 1) {
    uVar25 = 0;
  }
  uVar13 = uVar12 + ~filter_frame_lookahead_idx;
  b_frames = ~filter_frame_lookahead_idx + (cpi->rc).frames_to_key;
  if ((int)b_frames < 1) {
    b_frames = 0;
  }
  uVar26 = (ulong)uVar25;
  if (filter_frame_lookahead_idx <= (int)uVar25) {
    uVar26 = (ulong)(uint)filter_frame_lookahead_idx;
  }
  if ((int)uVar13 < (int)b_frames) {
    b_frames = uVar13;
  }
  frame = av1_lookahead_peek(cpi->ppi->lookahead,filter_frame_lookahead_idx,cpi->compressor_stage);
  pSVar6 = (cpi->common).seq_params;
  bVar34 = pSVar6->monochrome == '\0';
  noise_level = (cpi->tf_ctx).noise_levels;
  av1_estimate_noise_level(&frame->img,noise_level,0,(uint)bVar34 * 2,pSVar6->bit_depth,0x32);
  dVar35 = av1_convert_qindex_to_q
                     ((cpi->ppi->p_rc).avg_frame_qindex
                      [(cpi->ppi->gf_group).frame_type[cpi->gf_frame_index]],
                      ((cpi->common).seq_params)->bit_depth);
  pFVar32 = (cpi->twopass_frame).stats_in;
  uVar9 = (ulong)((cpi->rc).frames_since_key == 0);
  if ((int)b_frames < 1) {
    dVar36 = 1.0;
  }
  else {
    pFVar27 = pFVar32 + (long)filter_frame_lookahead_idx + 1;
    dVar36 = 1.0;
    lVar29 = 0;
    do {
      if (((cpi->ppi->twopass).stats_buf_ctx)->stats_in_end <= pFVar27 + -uVar9) {
        b_frames = -(int)lVar29;
        break;
      }
      dVar39 = pFVar27[-uVar9].cor_coeff;
      if (dVar39 <= 0.001) {
        dVar39 = 0.001;
      }
      dVar36 = dVar36 * dVar39;
      lVar29 = lVar29 + -1;
      pFVar27 = pFVar27 + 1;
    } while (1 - (ulong)(b_frames + 1) != lVar29);
  }
  if (0 < (int)b_frames) {
    dVar36 = pow(dVar36,1.0 / (double)(int)b_frames);
  }
  uVar25 = (uint)uVar26;
  if ((int)uVar25 < 1) {
    dVar39 = 1.0;
  }
  else {
    pFVar32 = pFVar32 + filter_frame_lookahead_idx;
    dVar39 = 1.0;
    uVar28 = 0;
    do {
      if (pFVar32 + -uVar9 <= ((cpi->ppi->twopass).stats_buf_ctx)->stats_in_start) {
        uVar25 = (uint)uVar28;
        break;
      }
      dVar38 = pFVar32[-uVar9].cor_coeff;
      if (dVar38 <= 0.001) {
        dVar38 = 0.001;
      }
      dVar39 = dVar39 * dVar38;
      uVar28 = uVar28 + 1;
      pFVar32 = pFVar32 + -1;
    } while (uVar26 != uVar28);
  }
  if (0 < (int)uVar25) {
    dVar39 = pow(dVar39,1.0 / (double)(int)uVar25);
  }
  uVar13 = 0;
  if ((1 < iVar14) &&
     ((((iVar14 = (cpi->sf).hl_sf.adjust_num_frames_for_arf_filtering, FVar3 != '\0' ||
        (10 < (int)dVar35)) && (uVar13 = 6, FVar3 != '\0' && 0 < iVar14)) &&
      (0 < (cpi->rc).frames_since_key)))) {
    lVar29 = (ulong)(iVar14 - 1) * 3;
    pbVar16 = &DAT_00504a80 + lVar29;
    dVar35 = *noise_level;
    if (0.5 <= dVar35) {
      if (1.0 <= dVar35) {
        pbVar16 = &DAT_00504a82 + lVar29;
      }
      else {
        pbVar16 = &DAT_00504a81 + lVar29;
      }
    }
    uVar13 = (uint)*pbVar16;
  }
  uVar31 = uVar13 + iVar37;
  if ((int)uVar12 <= (int)(uVar13 + iVar37)) {
    uVar31 = uVar12;
  }
  if (FVar4 == '\0') {
    uVar12 = (int)uVar31 / 2;
    if (iVar11 == 0) {
      uVar12 = 0;
    }
    if ((int)uVar25 <= (int)uVar12) {
      uVar12 = uVar25;
    }
    uVar13 = uVar31 - 1;
    if ((int)b_frames <= (int)(uVar31 - 1)) {
      uVar13 = b_frames;
    }
  }
  else {
    iVar14 = av1_calc_arf_boost(&cpi->ppi->twopass,&cpi->twopass_frame,&cpi->ppi->p_rc,
                                &cpi->frame_info,filter_frame_lookahead_idx,uVar25,b_frames,
                                (int *)0x0,(int *)0x0,0);
    uVar12 = iVar14 / 0x96;
    if ((int)uVar31 < iVar14 / 0x96) {
      uVar12 = uVar31;
    }
    uVar12 = uVar12 | 1;
    uVar31 = 3;
    if ((int)uVar12 < 3) {
      uVar31 = uVar12;
    }
    if (FVar3 != '\x06') {
      uVar31 = uVar12;
    }
    uVar15 = uVar25;
    if ((int)b_frames < (int)uVar25) {
      uVar15 = b_frames;
    }
    uVar13 = (int)uVar31 / 2;
    uVar12 = uVar13;
    if ((int)uVar15 < (int)uVar13) {
      uVar33 = b_frames;
      uVar15 = uVar25;
      if ((int)b_frames < (int)uVar13) {
        uVar15 = uVar31 + ~b_frames;
        if ((int)uVar25 <= (int)(uVar31 + ~b_frames)) {
          uVar15 = uVar25;
        }
      }
      else {
        uVar33 = uVar31 + ~uVar25;
        if ((int)b_frames <= (int)(uVar31 + ~uVar25)) {
          uVar33 = b_frames;
        }
      }
      uVar13 = uVar33;
      uVar12 = uVar15;
      if ((0 < (int)b_frames) && (0 < (int)uVar25)) {
        if ((int)uVar33 < (int)uVar15) {
          dVar36 = 1.0 - dVar36;
          if (dVar36 <= 0.01) {
            dVar36 = 0.01;
          }
          uVar12 = (int)(0.4 / dVar36) + uVar33;
          if ((int)uVar15 < (int)uVar12) {
            uVar12 = uVar15;
          }
        }
        else {
          dVar39 = 1.0 - dVar39;
          if (dVar39 <= 0.01) {
            dVar39 = 0.01;
          }
          uVar13 = (int)(0.4 / dVar39) + uVar15;
          if ((int)uVar33 < (int)uVar13) {
            uVar13 = uVar33;
          }
        }
      }
    }
  }
  iVar14 = (uint)bVar34 * 2 + 1;
  uVar25 = uVar13 + uVar12 + 1;
  if (0 < (int)uVar25) {
    uVar26 = 0;
    do {
      plVar17 = av1_lookahead_peek(cpi->ppi->lookahead,
                                   (filter_frame_lookahead_idx - uVar12) + (int)uVar26,
                                   cpi->compressor_stage);
      (cpi->tf_ctx).frames[uVar26] = &plVar17->img;
      uVar26 = uVar26 + 1;
    } while (uVar25 != uVar26);
  }
  pTVar1 = &(cpi->td).tf_data;
  (cpi->tf_ctx).num_frames = uVar25;
  (cpi->tf_ctx).filter_frame_idx = uVar12;
  av1_setup_src_planes(&(cpi->td).mb,&frame->img,0,0,iVar14,((cpi->common).seq_params)->sb_size);
  pSVar6 = (cpi->common).seq_params;
  av1_setup_block_planes(&(cpi->td).mb.e_mbd,pSVar6->subsampling_x,pSVar6->subsampling_y,iVar14);
  sf = &(cpi->tf_ctx).sf;
  pYVar7 = (cpi->tf_ctx).frames[0];
  iVar14 = (pYVar7->field_2).field_0.y_crop_width;
  iVar37 = (pYVar7->field_3).field_0.y_crop_height;
  av1_setup_scale_factors_for_frame(sf,iVar14,iVar37,iVar14,iVar37);
  pYVar7 = (cpi->tf_ctx).frames[(cpi->tf_ctx).filter_frame_idx];
  uVar25 = pYVar7->flags;
  pSVar6 = (cpi->common).seq_params;
  piVar30 = &(cpi->td).mb.e_mbd.plane[0].subsampling_y;
  iVar14 = 0;
  uVar26 = 0;
  do {
    iVar14 = (0x400U >> ((char)*piVar30 + (char)piVar30[-1] & 0x1fU)) + iVar14;
    if (pSVar6->monochrome != '\0') break;
    piVar30 = piVar30 + 0x28c;
    bVar34 = uVar26 < 2;
    uVar26 = uVar26 + 1;
  } while (bVar34);
  iVar37 = (pYVar7->field_3).field_0.y_crop_height + 0x1f;
  iVar11 = (pYVar7->field_2).field_0.y_crop_width + 0x1f;
  (cpi->tf_ctx).num_pels = iVar14;
  (cpi->tf_ctx).mb_rows = (int)(((uint)(iVar37 >> 0x1f) >> 0x1b) + iVar37) >> 5;
  (cpi->tf_ctx).mb_cols = (int)(((uint)(iVar11 >> 0x1f) >> 0x1b) + iVar11) >> 5;
  (cpi->tf_ctx).is_highbitdepth = uVar25 >> 3 & 1;
  dVar35 = av1_convert_qindex_to_q
                     ((cpi->ppi->p_rc).avg_frame_qindex
                      [(cpi->ppi->gf_group).frame_type[cpi->gf_frame_index]],pSVar6->bit_depth);
  (cpi->tf_ctx).q_factor = (int)dVar35;
  iVar14 = (cpi->tf_ctx).is_highbitdepth;
  iVar37 = (cpi->tf_ctx).num_pels;
  size = (size_t)iVar37;
  pMVar18 = (MB_MODE_INFO *)aom_calloc(1,0xb0);
  (cpi->td).tf_data.tmp_mbmi = pMVar18;
  puVar19 = (uint32_t *)aom_memalign(0x10,size * 4);
  (cpi->td).tf_data.accum = puVar19;
  puVar20 = (uint16_t *)aom_memalign(0x10,size * 2);
  (cpi->td).tf_data.count = puVar20;
  if (iVar14 == 0) {
    puVar22 = (uint8_t *)aom_memalign(0x20,size);
  }
  else {
    pvVar21 = aom_memalign(0x20,(long)(iVar37 * 2));
    puVar22 = (uint8_t *)((ulong)pvVar21 >> 1);
  }
  (cpi->td).tf_data.pred = puVar22;
  if ((((cpi->td).tf_data.tmp_mbmi == (MB_MODE_INFO *)0x0) ||
      ((cpi->td).tf_data.accum == (uint32_t *)0x0)) ||
     (((cpi->td).tf_data.count == (uint16_t *)0x0 || ((cpi->td).tf_data.pred == (uint8_t *)0x0)))) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                       "Error allocating temporal filter data");
  }
  else {
    (pTVar1->diff).sum = 0;
    (cpi->td).tf_data.diff.sse = 0;
  }
  if ((cpi->mt_info).num_workers < 2) {
    lVar29 = (ulong)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1;
    pbVar23 = (cpi->td).mb.e_mbd.plane[0].pre;
    lVar24 = 0;
    do {
      auStack_48[lVar24] = pbVar23->buf;
      lVar24 = lVar24 + 1;
      pbVar23 = (buf_2d *)((long)(pbVar23 + 0x51) + 0x10);
    } while (lVar29 != lVar24);
    ppMVar8 = (cpi->td).mb.e_mbd.mi;
    (cpi->td).mb.e_mbd.block_ref_scale_factors[0] = sf;
    (cpi->td).mb.e_mbd.block_ref_scale_factors[1] = sf;
    (cpi->td).mb.e_mbd.mi = &(cpi->td).tf_data.tmp_mbmi;
    ((cpi->td).tf_data.tmp_mbmi)->motion_mode = '\0';
    if (0 < (cpi->tf_ctx).mb_rows) {
      iVar37 = 0;
      do {
        av1_tf_do_filtering_row(cpi,&cpi->td,iVar37);
        iVar37 = iVar37 + 1;
      } while (iVar37 < (cpi->tf_ctx).mb_rows);
    }
    pbVar23 = (cpi->td).mb.e_mbd.plane[0].pre;
    lVar24 = 0;
    do {
      pbVar23->buf = (uint8_t *)auStack_48[lVar24];
      lVar24 = lVar24 + 1;
      pbVar23 = (buf_2d *)((long)(pbVar23 + 0x51) + 0x10);
    } while (lVar29 != lVar24);
    (cpi->td).mb.e_mbd.mi = ppMVar8;
  }
  else {
    av1_tf_do_filtering_mt(cpi);
  }
  if (frame_diff != (FRAME_DIFF *)0x0) {
    iVar10 = (cpi->td).tf_data.diff.sse;
    frame_diff->sum = (pTVar1->diff).sum;
    frame_diff->sse = iVar10;
  }
  if (iVar14 != 0) {
    ppuVar2 = &(cpi->td).tf_data.pred;
    *ppuVar2 = (uint8_t *)((long)*ppuVar2 << 1);
  }
  aom_free((cpi->td).tf_data.tmp_mbmi);
  (cpi->td).tf_data.tmp_mbmi = (MB_MODE_INFO *)0x0;
  aom_free((cpi->td).tf_data.accum);
  (cpi->td).tf_data.accum = (uint32_t *)0x0;
  aom_free((cpi->td).tf_data.count);
  (cpi->td).tf_data.count = (uint16_t *)0x0;
  aom_free((cpi->td).tf_data.pred);
  (cpi->td).tf_data.pred = (uint8_t *)0x0;
  return;
}

Assistant:

void av1_temporal_filter(AV1_COMP *cpi, const int filter_frame_lookahead_idx,
                         int gf_frame_index, FRAME_DIFF *frame_diff,
                         YV12_BUFFER_CONFIG *output_frame) {
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  // Basic informaton of the current frame.
  TemporalFilterCtx *tf_ctx = &cpi->tf_ctx;
  TemporalFilterData *tf_data = &cpi->td.tf_data;
  const int compute_frame_diff = frame_diff != NULL;
  // TODO(anyone): Currently, we enforce the filtering strength on internal
  // ARFs except the second ARF to be zero. We should investigate in which case
  // it is more beneficial to use non-zero strength filtering.
  // Only parallel level 0 frames go through temporal filtering.
  assert(cpi->ppi->gf_group.frame_parallel_level[gf_frame_index] == 0);

  // Initialize temporal filter context structure.
  init_tf_ctx(cpi, filter_frame_lookahead_idx, gf_frame_index,
              compute_frame_diff, output_frame);

  // Allocate and reset temporal filter buffers.
  const int is_highbitdepth = tf_ctx->is_highbitdepth;
  if (!tf_alloc_and_reset_data(tf_data, tf_ctx->num_pels, is_highbitdepth)) {
    aom_internal_error(cpi->common.error, AOM_CODEC_MEM_ERROR,
                       "Error allocating temporal filter data");
  }

  // Perform temporal filtering process.
  if (mt_info->num_workers > 1)
    av1_tf_do_filtering_mt(cpi);
  else
    tf_do_filtering(cpi);

  if (compute_frame_diff) {
    *frame_diff = tf_data->diff;
  }
  // Deallocate temporal filter buffers.
  tf_dealloc_data(tf_data, is_highbitdepth);
}